

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_timer.hpp
# Opt level: O1

void __thiscall pico_tree::scoped_timer::~scoped_timer(scoped_timer *this)

{
  long lVar1;
  pointer pcVar2;
  long lVar3;
  ostream *poVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  double dVar6;
  
  lVar3 = std::chrono::_V2::system_clock::now();
  lVar1 = (this->start_).__d.__r;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->name_)._M_dataplus._M_p,
                      (this->name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] Elapsed time: ",0x10);
  dVar6 = (double)(lVar3 - lVar1) / 1000000000.0;
  poVar4 = std::ostream::_M_insert<double>(dVar6 * 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ms\n",4);
  if (1 < this->times_) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(this->name_)._M_dataplus._M_p,
                        (this->name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] Average time: ",0x10);
    poVar4 = std::ostream::_M_insert<double>
                       ((dVar6 / (((double)CONCAT44(0x45300000,(int)(this->times_ >> 0x20)) -
                                  1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)this->times_) -
                                 4503599627370496.0))) * 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ms\n",4);
  }
  pcVar2 = (this->name_)._M_dataplus._M_p;
  paVar5 = &(this->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar5) {
    operator_delete(pcVar2,paVar5->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~scoped_timer() {
    std::chrono::duration<double> elapsed_seconds =
        std::chrono::high_resolution_clock::now() - start_;
    std::cout << "[" << name_
              << "] Elapsed time: " << (elapsed_seconds.count() * 1000.0)
              << " ms\n";

    if (times_ > 1) {
      std::cout << "[" << name_ << "] Average time: "
                << ((elapsed_seconds.count() / static_cast<double>(times_)) *
                    1000.0)
                << " ms\n";
    }
  }